

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  seqDef *psVar1;
  ZSTD_Sequence *pZVar2;
  size_t sVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  seqStore_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_60;
  U32 UStack_5c;
  U32 rawOffset;
  repcodes_t updatedRepcodes;
  size_t i;
  ZSTD_Sequence *outSeqs;
  size_t lastLLSize;
  size_t literalsRead;
  size_t seqStoreLiteralsSize;
  size_t seqStoreSeqSize;
  seqDef *seqStoreSeqs;
  seqStore_t *seqStore;
  ZSTD_CCtx *zc_local;
  
  psVar5 = ZSTD_getSeqStore(zc);
  psVar1 = psVar5->sequencesStart;
  uVar6 = (long)psVar5->sequences - (long)psVar1 >> 3;
  uVar7 = (long)psVar5->lit - (long)psVar5->litStart;
  lastLLSize = 0;
  pZVar2 = (zc->seqCollector).seqStart;
  sVar3 = (zc->seqCollector).seqIndex;
  if ((zc->seqCollector).maxSequences <= (zc->seqCollector).seqIndex + 1) {
    __assert_fail("zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xcf8,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  if ((zc->seqCollector).maxSequences < uVar6 + 1) {
    __assert_fail("zc->seqCollector.maxSequences >= seqStoreSeqSize + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xcfa,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  pZVar4 = (zc->blockState).prevCBlock;
  _UStack_5c = *(undefined8 *)pZVar4->rep;
  updatedRepcodes.rep[0] = pZVar4->rep[2];
  updatedRepcodes.rep[1] = 0;
  updatedRepcodes.rep[2] = 0;
  for (; (ulong)updatedRepcodes.rep._4_8_ < uVar6;
      updatedRepcodes.rep._4_8_ = updatedRepcodes.rep._4_8_ + 1) {
    local_60 = psVar1[updatedRepcodes.rep._4_8_].offBase - 3;
    pZVar2[sVar3 + updatedRepcodes.rep._4_8_].litLength =
         (uint)psVar1[updatedRepcodes.rep._4_8_].litLength;
    pZVar2[sVar3 + updatedRepcodes.rep._4_8_].matchLength =
         psVar1[updatedRepcodes.rep._4_8_].mlBase + 3;
    pZVar2[sVar3 + updatedRepcodes.rep._4_8_].rep = 0;
    if (updatedRepcodes.rep._4_8_ == (ulong)psVar5->longLengthPos) {
      if (psVar5->longLengthType == ZSTD_llt_literalLength) {
        pZVar2[sVar3 + updatedRepcodes.rep._4_8_].litLength =
             pZVar2[sVar3 + updatedRepcodes.rep._4_8_].litLength + 0x10000;
      }
      else if (psVar5->longLengthType == ZSTD_llt_matchLength) {
        pZVar2[sVar3 + updatedRepcodes.rep._4_8_].matchLength =
             pZVar2[sVar3 + updatedRepcodes.rep._4_8_].matchLength + 0x10000;
      }
    }
    if (psVar1[updatedRepcodes.rep._4_8_].offBase < 4) {
      pZVar2[sVar3 + updatedRepcodes.rep._4_8_].rep = psVar1[updatedRepcodes.rep._4_8_].offBase;
      if (pZVar2[sVar3 + updatedRepcodes.rep._4_8_].litLength == 0) {
        if (pZVar2[sVar3 + updatedRepcodes.rep._4_8_].rep == 3) {
          local_60 = UStack_5c - 1;
        }
        else {
          local_60 = *(uint *)((long)&stack0xffffffffffffffa4 +
                              (ulong)pZVar2[sVar3 + updatedRepcodes.rep._4_8_].rep * 4);
        }
      }
      else {
        local_60 = *(uint *)((long)&stack0xffffffffffffffa4 +
                            (ulong)(pZVar2[sVar3 + updatedRepcodes.rep._4_8_].rep - 1) * 4);
      }
    }
    pZVar2[sVar3 + updatedRepcodes.rep._4_8_].offset = local_60;
    ZSTD_updateRep(&stack0xffffffffffffffa4,psVar1[updatedRepcodes.rep._4_8_].offBase,
                   (uint)(psVar1[updatedRepcodes.rep._4_8_].litLength == 0));
    lastLLSize = pZVar2[sVar3 + updatedRepcodes.rep._4_8_].litLength + lastLLSize;
  }
  if (uVar7 < lastLLSize) {
    __assert_fail("seqStoreLiteralsSize >= literalsRead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xd23,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  pZVar2[sVar3 + updatedRepcodes.rep._4_8_].litLength = (int)uVar7 - (int)lastLLSize;
  pZVar2[sVar3 + updatedRepcodes.rep._4_8_].rep = 0;
  pZVar2[sVar3 + updatedRepcodes.rep._4_8_].offset = 0;
  pZVar2[sVar3 + updatedRepcodes.rep._4_8_].matchLength = 0;
  (zc->seqCollector).seqIndex = uVar6 + 1 + (zc->seqCollector).seqIndex;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offBase - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offBase <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offBase;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        ZSTD_updateRep(updatedRepcodes.rep,
                       seqStoreSeqs[i].offBase,
                       seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}